

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QWidget_*>::data(QList<QWidget_*> *this)

{
  QArrayDataPointer<QWidget_*> *this_00;
  QWidget **ppQVar1;
  QArrayDataPointer<QWidget_*> *in_RDI;
  
  detach((QList<QWidget_*> *)0x5850bc);
  this_00 = (QArrayDataPointer<QWidget_*> *)QArrayDataPointer<QWidget_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QWidget_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }